

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  FILE *__stream;
  size_t l;
  size_t local_4d0;
  FILE *f;
  ssize_t s;
  stat st;
  char buff [1024];
  char *f1_local;
  wchar_t line_local;
  char *filename_local;
  
  assertion_count(filename,line);
  iVar1 = stat(f1,(stat *)&s);
  if (iVar1 == 0) {
    if (st.st_rdev == 0) {
      filename_local._4_4_ = L'\x01';
    }
    else {
      failure_start(filename,line,"File should be empty: %s",f1);
      logprintf("    File size: %d\n",st.st_rdev & 0xffffffff);
      logprintf("    Contents:\n");
      __stream = fopen(f1,"rb");
      if (__stream == (FILE *)0x0) {
        logprintf("    Unable to open %s\n",f1);
      }
      else {
        if ((long)st.st_rdev < 0x401) {
          local_4d0 = st.st_rdev;
        }
        else {
          local_4d0 = 0x400;
        }
        l = fread(st.__glibc_reserved + 2,1,local_4d0,__stream);
        hexdump((char *)(st.__glibc_reserved + 2),(char *)0x0,l,0);
        fclose(__stream);
      }
      failure_finish((void *)0x0);
      filename_local._4_4_ = L'\0';
    }
  }
  else {
    failure_start(filename,line,"Stat failed: %s",f1);
    failure_finish((void *)0x0);
    filename_local._4_4_ = L'\0';
  }
  return filename_local._4_4_;
}

Assistant:

int
assertion_empty_file(const char *filename, int line, const char *f1)
{
	char buff[1024];
	struct stat st;
	ssize_t s;
	FILE *f;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0)
		return (1);

	failure_start(filename, line, "File should be empty: %s", f1);
	logprintf("    File size: %d\n", (int)st.st_size);
	logprintf("    Contents:\n");
	f = fopen(f1, "rb");
	if (f == NULL) {
		logprintf("    Unable to open %s\n", f1);
	} else {
		s = ((off_t)sizeof(buff) < st.st_size) ?
		    (ssize_t)sizeof(buff) : (ssize_t)st.st_size;
		s = fread(buff, 1, s, f);
		hexdump(buff, NULL, s, 0);
		fclose(f);
	}
	failure_finish(NULL);
	return (0);
}